

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::quadratic_cost_type<float>::make_l1_norm(quadratic_cost_type<float> *this,int n)

{
  int iVar1;
  bool bVar2;
  type pfVar3;
  type piVar4;
  type pqVar5;
  unique_ptr<float[],_std::default_delete<float[]>_> *this_00;
  unique_ptr<baryonyx::itm::quadratic_cost_type<float>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
  *this_01;
  float fVar6;
  int local_2c;
  int e_1;
  int i_3;
  int i_2;
  int e;
  int i_1;
  int i;
  float div;
  int n_local;
  quadratic_cost_type<float> *this_local;
  
  i_1 = 0;
  for (e = 0; e != n; e = e + 1) {
    this_00 = &this->linear_elements;
    pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](this_00,(long)e);
    fVar6 = *pfVar3;
    std::abs((int)this_00);
    i_1 = (int)(fVar6 + (float)i_1);
  }
  i_2 = 0;
  piVar4 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&this->indices,(long)n);
  iVar1 = *piVar4;
  for (; i_2 != iVar1; i_2 = i_2 + 1) {
    this_01 = &this->quadratic_elements;
    pqVar5 = std::
             unique_ptr<baryonyx::itm::quadratic_cost_type<float>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             ::operator[](this_01,(long)i_2);
    fVar6 = pqVar5->factor;
    std::abs((int)this_01);
    i_1 = (int)(fVar6 + (float)i_1);
  }
  bVar2 = std::isnormal((float)i_1);
  if (bVar2) {
    for (e_1 = 0; e_1 != n; e_1 = e_1 + 1) {
      pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                         (&this->linear_elements,(long)e_1);
      *pfVar3 = *pfVar3 / (float)i_1;
    }
    local_2c = 0;
    piVar4 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&this->indices,(long)n)
    ;
    iVar1 = *piVar4;
    for (; local_2c != iVar1; local_2c = local_2c + 1) {
      pqVar5 = std::
               unique_ptr<baryonyx::itm::quadratic_cost_type<float>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
               ::operator[](&this->quadratic_elements,(long)local_2c);
      pqVar5->factor = pqVar5->factor / (float)i_1;
    }
  }
  return;
}

Assistant:

void make_l1_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += std::abs(linear_elements[i]);

        for (int i = 0, e = indices[n]; i != e; ++i)
            div += std::abs(quadratic_elements[i].factor);

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }